

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::avx2::
BVHNIntersector1<8,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Pluecker<4,_true>_>_>
::intersect(BVHNIntersector1<8,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Pluecker<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  uint uVar15;
  undefined1 (*pauVar16) [16];
  undefined4 uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  RayQueryContext *pRVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar88;
  float fVar89;
  undefined1 auVar87 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  float fVar104;
  undefined1 auVar103 [16];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar108;
  float fVar109;
  undefined1 auVar107 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2791;
  undefined1 local_2790 [16];
  long local_2780;
  undefined8 uStack_2778;
  ulong local_2768;
  ulong local_2760;
  Intersectors *local_2758;
  RayHit *local_2750;
  int local_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined8 local_2710;
  float fStack_2708;
  float fStack_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  long local_26c8;
  int *local_26c0;
  RayQueryContext *local_26b8;
  undefined4 *local_26b0;
  Intersectors *local_26a8;
  undefined4 *local_26a0;
  undefined4 local_2698;
  undefined4 local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined4 local_2684;
  undefined4 local_2680;
  undefined4 local_267c;
  uint local_2678;
  undefined4 local_2674;
  undefined4 local_2670;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined1 local_2650 [16];
  undefined1 local_2640 [32];
  undefined1 local_2620 [16];
  undefined1 *local_2610;
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [2] [16];
  undefined1 local_2580 [32];
  undefined4 local_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    pauVar25 = (undefined1 (*) [16])local_2390;
    local_23a0 = *(long *)(*(long *)this + 0x70);
    uStack_2398 = 0;
    auVar45 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)((long)&This->leafIntersector + 4)));
    auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)&(This->intersector1).intersect));
    local_2650._8_4_ = 0x7fffffff;
    local_2650._0_8_ = 0x7fffffff7fffffff;
    local_2650._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx((undefined1  [16])This->collider,local_2650);
    auVar79._8_4_ = 0x219392ef;
    auVar79._0_8_ = 0x219392ef219392ef;
    auVar79._12_4_ = 0x219392ef;
    auVar38 = vcmpps_avx(auVar38,auVar79,1);
    auVar80._8_4_ = 0x3f800000;
    auVar80._0_8_ = 0x3f8000003f800000;
    auVar80._12_4_ = 0x3f800000;
    auVar79 = vdivps_avx(auVar80,(undefined1  [16])This->collider);
    auVar67._8_4_ = 0x5d5e0b6b;
    auVar67._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar67._12_4_ = 0x5d5e0b6b;
    auVar38 = vblendvps_avx(auVar79,auVar67,auVar38);
    auVar60._0_4_ = auVar38._0_4_ * 0.99999964;
    auVar60._4_4_ = auVar38._4_4_ * 0.99999964;
    auVar60._8_4_ = auVar38._8_4_ * 0.99999964;
    auVar60._12_4_ = auVar38._12_4_ * 0.99999964;
    uVar17 = *(undefined4 *)&This->ptr;
    local_23c0._4_4_ = uVar17;
    local_23c0._0_4_ = uVar17;
    local_23c0._8_4_ = uVar17;
    local_23c0._12_4_ = uVar17;
    local_23c0._16_4_ = uVar17;
    local_23c0._20_4_ = uVar17;
    local_23c0._24_4_ = uVar17;
    local_23c0._28_4_ = uVar17;
    auVar87 = ZEXT3264(local_23c0);
    uVar17 = *(undefined4 *)((long)&This->ptr + 4);
    local_23e0._4_4_ = uVar17;
    local_23e0._0_4_ = uVar17;
    local_23e0._8_4_ = uVar17;
    local_23e0._12_4_ = uVar17;
    local_23e0._16_4_ = uVar17;
    local_23e0._20_4_ = uVar17;
    local_23e0._24_4_ = uVar17;
    local_23e0._28_4_ = uVar17;
    auVar91 = ZEXT3264(local_23e0);
    uVar17 = *(undefined4 *)&This->leafIntersector;
    local_2400._4_4_ = uVar17;
    local_2400._0_4_ = uVar17;
    local_2400._8_4_ = uVar17;
    local_2400._12_4_ = uVar17;
    local_2400._16_4_ = uVar17;
    local_2400._20_4_ = uVar17;
    local_2400._24_4_ = uVar17;
    local_2400._28_4_ = uVar17;
    auVar92 = ZEXT3264(local_2400);
    auVar53._0_4_ = auVar38._0_4_ * 1.0000004;
    auVar53._4_4_ = auVar38._4_4_ * 1.0000004;
    auVar53._8_4_ = auVar38._8_4_ * 1.0000004;
    auVar53._12_4_ = auVar38._12_4_ * 1.0000004;
    auVar38 = vmovshdup_avx(auVar60);
    uVar52 = auVar38._0_8_;
    local_2440._8_8_ = uVar52;
    local_2440._0_8_ = uVar52;
    local_2440._16_8_ = uVar52;
    local_2440._24_8_ = uVar52;
    auVar100 = ZEXT3264(local_2440);
    auVar80 = vshufpd_avx(auVar60,auVar60,1);
    auVar79 = vshufps_avx(auVar60,auVar60,0xaa);
    uVar52 = auVar79._0_8_;
    local_2460._8_8_ = uVar52;
    local_2460._0_8_ = uVar52;
    local_2460._16_8_ = uVar52;
    local_2460._24_8_ = uVar52;
    auVar102 = ZEXT3264(local_2460);
    uVar22 = (ulong)(auVar60._0_4_ < 0.0) << 5;
    auVar79 = vmovshdup_avx(auVar53);
    uVar52 = auVar79._0_8_;
    local_24a0._8_8_ = uVar52;
    local_24a0._0_8_ = uVar52;
    local_24a0._16_8_ = uVar52;
    local_24a0._24_8_ = uVar52;
    auVar105 = ZEXT3264(local_24a0);
    auVar79 = vshufps_avx(auVar53,auVar53,0xaa);
    uVar52 = auVar79._0_8_;
    local_24c0._8_8_ = uVar52;
    local_24c0._0_8_ = uVar52;
    local_24c0._16_8_ = uVar52;
    local_24c0._24_8_ = uVar52;
    auVar107 = ZEXT3264(local_24c0);
    uVar23 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
    uVar21 = (ulong)(auVar80._0_4_ < 0.0) << 5 | 0x80;
    uVar24 = uVar22 ^ 0x20;
    uVar28 = uVar23 ^ 0x20;
    uVar17 = auVar45._0_4_;
    local_2580._4_4_ = uVar17;
    local_2580._0_4_ = uVar17;
    local_2580._8_4_ = uVar17;
    local_2580._12_4_ = uVar17;
    local_2580._16_4_ = uVar17;
    local_2580._20_4_ = uVar17;
    local_2580._24_4_ = uVar17;
    local_2580._28_4_ = uVar17;
    auVar81 = ZEXT3264(local_2580);
    uVar17 = auVar54._0_4_;
    auVar37 = ZEXT3264(CONCAT428(uVar17,CONCAT424(uVar17,CONCAT420(uVar17,CONCAT416(uVar17,CONCAT412
                                                  (uVar17,CONCAT48(uVar17,CONCAT44(uVar17,uVar17))))
                                                  ))));
    local_2660 = mm_lookupmask_ps._240_8_;
    uStack_2658 = mm_lookupmask_ps._248_8_;
    local_2420 = auVar60._0_4_;
    fStack_241c = auVar60._0_4_;
    fStack_2418 = auVar60._0_4_;
    fStack_2414 = auVar60._0_4_;
    fStack_2410 = auVar60._0_4_;
    fStack_240c = auVar60._0_4_;
    fStack_2408 = auVar60._0_4_;
    fStack_2404 = auVar60._0_4_;
    local_2480 = auVar53._0_4_;
    fStack_247c = auVar53._0_4_;
    fStack_2478 = auVar53._0_4_;
    fStack_2474 = auVar53._0_4_;
    fStack_2470 = auVar53._0_4_;
    fStack_246c = auVar53._0_4_;
    fStack_2468 = auVar53._0_4_;
    fStack_2464 = auVar53._0_4_;
    fVar94 = auVar60._0_4_;
    fVar95 = auVar60._0_4_;
    fVar96 = auVar60._0_4_;
    fVar97 = auVar60._0_4_;
    fVar98 = auVar60._0_4_;
    fVar99 = auVar60._0_4_;
    fVar104 = auVar53._0_4_;
    fVar82 = auVar53._0_4_;
    fVar88 = auVar53._0_4_;
    fVar89 = auVar53._0_4_;
    fVar90 = auVar53._0_4_;
    fVar106 = auVar53._0_4_;
    local_2768 = uVar23;
    local_2760 = uVar22;
    local_2758 = This;
    local_2750 = ray;
LAB_0150fb75:
    if (pauVar25 != (undefined1 (*) [16])&local_23a0) {
      pauVar16 = pauVar25 + -1;
      pauVar25 = pauVar25 + -1;
      if (*(float *)(*pauVar16 + 8) <= *(float *)&(This->intersector1).intersect) {
        pRVar26 = *(RayQueryContext **)*pauVar25;
        while (((ulong)pRVar26 & 8) == 0) {
          auVar6 = vsubps_avx(*(undefined1 (*) [32])((long)&pRVar26[2].args + uVar22),auVar87._0_32_
                             );
          auVar7._4_4_ = fVar94 * auVar6._4_4_;
          auVar7._0_4_ = auVar60._0_4_ * auVar6._0_4_;
          auVar7._8_4_ = fVar95 * auVar6._8_4_;
          auVar7._12_4_ = fVar96 * auVar6._12_4_;
          auVar7._16_4_ = fVar97 * auVar6._16_4_;
          auVar7._20_4_ = fVar98 * auVar6._20_4_;
          auVar7._24_4_ = fVar99 * auVar6._24_4_;
          auVar7._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])((long)&pRVar26[2].args + uVar23),auVar91._0_32_
                             );
          auVar9._4_4_ = auVar100._4_4_ * auVar6._4_4_;
          auVar9._0_4_ = auVar100._0_4_ * auVar6._0_4_;
          auVar9._8_4_ = auVar100._8_4_ * auVar6._8_4_;
          auVar9._12_4_ = auVar100._12_4_ * auVar6._12_4_;
          auVar9._16_4_ = auVar100._16_4_ * auVar6._16_4_;
          auVar9._20_4_ = auVar100._20_4_ * auVar6._20_4_;
          auVar9._24_4_ = auVar100._24_4_ * auVar6._24_4_;
          auVar9._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar7,auVar9);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])((long)&pRVar26[2].args + uVar21),auVar92._0_32_
                             );
          auVar10._4_4_ = auVar102._4_4_ * auVar7._4_4_;
          auVar10._0_4_ = auVar102._0_4_ * auVar7._0_4_;
          auVar10._8_4_ = auVar102._8_4_ * auVar7._8_4_;
          auVar10._12_4_ = auVar102._12_4_ * auVar7._12_4_;
          auVar10._16_4_ = auVar102._16_4_ * auVar7._16_4_;
          auVar10._20_4_ = auVar102._20_4_ * auVar7._20_4_;
          auVar10._24_4_ = auVar102._24_4_ * auVar7._24_4_;
          auVar10._28_4_ = auVar7._28_4_;
          auVar7 = vmaxps_avx(auVar10,auVar81._0_32_);
          local_2640 = vmaxps_avx(auVar6,auVar7);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])((long)&pRVar26[2].args + uVar24),auVar87._0_32_
                             );
          auVar11._4_4_ = fVar104 * auVar6._4_4_;
          auVar11._0_4_ = auVar53._0_4_ * auVar6._0_4_;
          auVar11._8_4_ = fVar82 * auVar6._8_4_;
          auVar11._12_4_ = fVar88 * auVar6._12_4_;
          auVar11._16_4_ = fVar89 * auVar6._16_4_;
          auVar11._20_4_ = fVar90 * auVar6._20_4_;
          auVar11._24_4_ = fVar106 * auVar6._24_4_;
          auVar11._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])((long)&pRVar26[2].args + uVar28),auVar91._0_32_
                             );
          auVar12._4_4_ = auVar105._4_4_ * auVar6._4_4_;
          auVar12._0_4_ = auVar105._0_4_ * auVar6._0_4_;
          auVar12._8_4_ = auVar105._8_4_ * auVar6._8_4_;
          auVar12._12_4_ = auVar105._12_4_ * auVar6._12_4_;
          auVar12._16_4_ = auVar105._16_4_ * auVar6._16_4_;
          auVar12._20_4_ = auVar105._20_4_ * auVar6._20_4_;
          auVar12._24_4_ = auVar105._24_4_ * auVar6._24_4_;
          auVar12._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar11,auVar12);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])((long)&pRVar26[2].args + (uVar21 ^ 0x20)),
                              auVar92._0_32_);
          auVar13._4_4_ = auVar107._4_4_ * auVar7._4_4_;
          auVar13._0_4_ = auVar107._0_4_ * auVar7._0_4_;
          auVar13._8_4_ = auVar107._8_4_ * auVar7._8_4_;
          auVar13._12_4_ = auVar107._12_4_ * auVar7._12_4_;
          auVar13._16_4_ = auVar107._16_4_ * auVar7._16_4_;
          auVar13._20_4_ = auVar107._20_4_ * auVar7._20_4_;
          auVar13._24_4_ = auVar107._24_4_ * auVar7._24_4_;
          auVar13._28_4_ = auVar7._28_4_;
          auVar7 = vminps_avx(auVar13,auVar37._0_32_);
          auVar6 = vminps_avx(auVar6,auVar7);
          auVar6 = vcmpps_avx(local_2640,auVar6,2);
          uVar15 = vmovmskps_avx(auVar6);
          if (uVar15 == 0) goto LAB_0150fb75;
          uVar15 = uVar15 & 0xff;
          uVar27 = (ulong)pRVar26 & 0xfffffffffffffff0;
          lVar19 = 0;
          for (uVar18 = (ulong)uVar15; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
          {
            lVar19 = lVar19 + 1;
          }
          context = *(RayQueryContext **)(uVar27 + lVar19 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          uVar18 = (ulong)uVar15;
          pRVar26 = context;
          if (uVar15 != 0) {
            uVar4 = *(uint *)(local_2640 + lVar19 * 4);
            lVar19 = 0;
            for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              lVar19 = lVar19 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar18 = (ulong)uVar15;
            pRVar26 = *(RayQueryContext **)(uVar27 + lVar19 * 8);
            uVar5 = *(uint *)(local_2640 + lVar19 * 4);
            if (uVar15 == 0) {
              if (uVar4 < uVar5) {
                *(RayQueryContext **)*pauVar25 = pRVar26;
                *(uint *)(*pauVar25 + 8) = uVar5;
                pauVar25 = pauVar25 + 1;
                pRVar26 = context;
              }
              else {
                *(RayQueryContext **)*pauVar25 = context;
                *(uint *)(*pauVar25 + 8) = uVar4;
                context = pRVar26;
                pauVar25 = pauVar25 + 1;
              }
            }
            else {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = context;
              auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar4));
              auVar45._8_8_ = 0;
              auVar45._0_8_ = pRVar26;
              auVar79 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar5));
              lVar19 = 0;
              for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar19 = lVar19 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              uVar18 = (ulong)uVar15;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)(uVar27 + lVar19 * 8);
              auVar54 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2640 + lVar19 * 4)));
              auVar45 = vpcmpgtd_avx(auVar79,auVar38);
              if (uVar15 == 0) {
                auVar80 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar79,auVar38,auVar80);
                auVar38 = vblendvps_avx(auVar38,auVar79,auVar80);
                auVar79 = vpcmpgtd_avx(auVar54,auVar45);
                auVar80 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar54,auVar45,auVar80);
                auVar45 = vblendvps_avx(auVar45,auVar54,auVar80);
                auVar54 = vpcmpgtd_avx(auVar45,auVar38);
                auVar80 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar45,auVar38,auVar80);
                auVar38 = vblendvps_avx(auVar38,auVar45,auVar80);
                *pauVar25 = auVar38;
                pauVar25[1] = auVar54;
                context = auVar79._0_8_;
                pauVar25 = pauVar25 + 2;
                pRVar26 = context;
              }
              else {
                lVar19 = 0;
                for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar19 = lVar19 + 1;
                }
                uVar15 = uVar15 - 1 & uVar15;
                uVar18 = (ulong)uVar15;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = *(ulong *)(uVar27 + lVar19 * 8);
                auVar80 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_2640 + lVar19 * 4)));
                if (uVar15 == 0) {
                  auVar67 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar79,auVar38,auVar67);
                  auVar38 = vblendvps_avx(auVar38,auVar79,auVar67);
                  auVar79 = vpcmpgtd_avx(auVar80,auVar54);
                  auVar67 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar80,auVar54,auVar67);
                  auVar54 = vblendvps_avx(auVar54,auVar80,auVar67);
                  auVar80 = vpcmpgtd_avx(auVar54,auVar38);
                  auVar67 = vpshufd_avx(auVar80,0xaa);
                  auVar80 = vblendvps_avx(auVar54,auVar38,auVar67);
                  auVar38 = vblendvps_avx(auVar38,auVar54,auVar67);
                  auVar54 = vpcmpgtd_avx(auVar79,auVar45);
                  auVar67 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar79,auVar45,auVar67);
                  auVar79 = vblendvps_avx(auVar45,auVar79,auVar67);
                  auVar45 = vpcmpgtd_avx(auVar80,auVar79);
                  auVar67 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar80,auVar79,auVar67);
                  auVar79 = vblendvps_avx(auVar79,auVar80,auVar67);
                  *pauVar25 = auVar38;
                  pauVar25[1] = auVar79;
                  pauVar25[2] = auVar45;
                  context = auVar54._0_8_;
                  pauVar16 = pauVar25 + 3;
                }
                else {
                  *pauVar25 = auVar38;
                  pauVar25[1] = auVar79;
                  pauVar25[2] = auVar54;
                  pauVar16 = pauVar25 + 3;
                  pauVar25[3] = auVar80;
                  do {
                    lVar19 = 0;
                    for (uVar22 = uVar18; (uVar22 & 1) == 0;
                        uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      lVar19 = lVar19 + 1;
                    }
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = *(ulong *)(uVar27 + lVar19 * 8);
                    auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_2640 + lVar19 * 4)));
                    pauVar16[1] = auVar38;
                    pauVar16 = pauVar16 + 1;
                    uVar18 = uVar18 - 1 & uVar18;
                  } while (uVar18 != 0);
                  lVar19 = 0;
                  while (pauVar16 != pauVar25) {
                    auVar38 = pauVar25[1];
                    uVar15 = vextractps_avx(auVar38,2);
                    for (lVar20 = 0x10;
                        (lVar19 != lVar20 && (*(uint *)(pauVar25[-1] + lVar20 + 8) < uVar15));
                        lVar20 = lVar20 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar25 + lVar20) =
                           *(undefined1 (*) [16])(pauVar25[-1] + lVar20);
                    }
                    *(undefined1 (*) [16])(*pauVar25 + lVar20) = auVar38;
                    lVar19 = lVar19 + -0x10;
                    pauVar25 = pauVar25 + 1;
                  }
                  context = *(RayQueryContext **)*pauVar16;
                  This = local_2758;
                  ray = local_2750;
                  uVar22 = local_2760;
                  uVar23 = local_2768;
                }
                auVar81 = ZEXT3264(local_2580);
                pauVar25 = pauVar16;
                pRVar26 = context;
              }
            }
          }
        }
        local_26c8 = (ulong)((uint)pRVar26 & 0xf) - 8;
        uVar18 = (ulong)pRVar26 & 0xfffffffffffffff0;
        lVar19 = 0;
        while (lVar19 != local_26c8) {
          lVar20 = lVar19 * 0xb0;
          uVar17 = *(undefined4 *)&This->ptr;
          auVar29._4_4_ = uVar17;
          auVar29._0_4_ = uVar17;
          auVar29._8_4_ = uVar17;
          auVar29._12_4_ = uVar17;
          uVar17 = *(undefined4 *)((long)&This->ptr + 4);
          auVar46._4_4_ = uVar17;
          auVar46._0_4_ = uVar17;
          auVar46._8_4_ = uVar17;
          auVar46._12_4_ = uVar17;
          uVar17 = *(undefined4 *)&This->leafIntersector;
          auVar55._4_4_ = uVar17;
          auVar55._0_4_ = uVar17;
          auVar55._8_4_ = uVar17;
          auVar55._12_4_ = uVar17;
          local_24d0 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + lVar20),auVar29);
          local_24e0 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x10 + lVar20),auVar46);
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + lVar20),auVar55);
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x30 + lVar20),auVar29);
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x40 + lVar20),auVar46);
          local_2720 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x50 + lVar20),auVar55);
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x60 + lVar20),auVar29);
          auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x70 + lVar20),auVar46);
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x80 + lVar20),auVar55);
          local_2730 = vsubps_avx(auVar45,local_24d0);
          local_2740 = vsubps_avx(auVar80,local_24e0);
          local_26f0 = vsubps_avx(auVar67,auVar54);
          auVar30._0_4_ = local_24d0._0_4_ + auVar45._0_4_;
          auVar30._4_4_ = local_24d0._4_4_ + auVar45._4_4_;
          auVar30._8_4_ = local_24d0._8_4_ + auVar45._8_4_;
          auVar30._12_4_ = local_24d0._12_4_ + auVar45._12_4_;
          auVar56._0_4_ = local_24e0._0_4_ + auVar80._0_4_;
          auVar56._4_4_ = local_24e0._4_4_ + auVar80._4_4_;
          auVar56._8_4_ = local_24e0._8_4_ + auVar80._8_4_;
          auVar56._12_4_ = local_24e0._12_4_ + auVar80._12_4_;
          fVar82 = auVar54._0_4_;
          auVar61._0_4_ = fVar82 + auVar67._0_4_;
          fVar88 = auVar54._4_4_;
          auVar61._4_4_ = fVar88 + auVar67._4_4_;
          fVar89 = auVar54._8_4_;
          auVar61._8_4_ = fVar89 + auVar67._8_4_;
          fVar90 = auVar54._12_4_;
          auVar61._12_4_ = fVar90 + auVar67._12_4_;
          auVar103._0_4_ = local_26f0._0_4_ * auVar56._0_4_;
          auVar103._4_4_ = local_26f0._4_4_ * auVar56._4_4_;
          auVar103._8_4_ = local_26f0._8_4_ * auVar56._8_4_;
          auVar103._12_4_ = local_26f0._12_4_ * auVar56._12_4_;
          auVar60 = vfmsub231ps_fma(auVar103,local_2740,auVar61);
          auVar62._0_4_ = auVar61._0_4_ * local_2730._0_4_;
          auVar62._4_4_ = auVar61._4_4_ * local_2730._4_4_;
          auVar62._8_4_ = auVar61._8_4_ * local_2730._8_4_;
          auVar62._12_4_ = auVar61._12_4_ * local_2730._12_4_;
          auVar53 = vfmsub231ps_fma(auVar62,local_26f0,auVar30);
          auVar31._0_4_ = local_2740._0_4_ * auVar30._0_4_;
          auVar31._4_4_ = local_2740._4_4_ * auVar30._4_4_;
          auVar31._8_4_ = local_2740._8_4_ * auVar30._8_4_;
          auVar31._12_4_ = local_2740._12_4_ * auVar30._12_4_;
          auVar68 = vfmsub231ps_fma(auVar31,local_2730,auVar56);
          local_2710._4_4_ = *(float *)&(This->collider).name;
          auVar101._0_4_ = local_2710._4_4_ * auVar68._0_4_;
          auVar101._4_4_ = local_2710._4_4_ * auVar68._4_4_;
          auVar101._8_4_ = local_2710._4_4_ * auVar68._8_4_;
          auVar101._12_4_ = local_2710._4_4_ * auVar68._12_4_;
          uVar17 = *(undefined4 *)((long)&(This->collider).collide + 4);
          auVar32._4_4_ = uVar17;
          auVar32._0_4_ = uVar17;
          auVar32._8_4_ = uVar17;
          auVar32._12_4_ = uVar17;
          auVar53 = vfmadd231ps_fma(auVar101,auVar32,auVar53);
          uVar17 = *(undefined4 *)&(This->collider).collide;
          local_2790._4_4_ = uVar17;
          local_2790._0_4_ = uVar17;
          local_2790._8_4_ = uVar17;
          local_2790._12_4_ = uVar17;
          local_2640._0_16_ = vfmadd231ps_fma(auVar53,local_2790,auVar60);
          local_2500 = vsubps_avx(local_24e0,auVar79);
          local_2510 = vsubps_avx(auVar54,local_2720);
          auVar57._0_4_ = local_24e0._0_4_ + auVar79._0_4_;
          auVar57._4_4_ = local_24e0._4_4_ + auVar79._4_4_;
          auVar57._8_4_ = local_24e0._8_4_ + auVar79._8_4_;
          auVar57._12_4_ = local_24e0._12_4_ + auVar79._12_4_;
          local_26e0 = auVar54;
          auVar63._0_4_ = local_2720._0_4_ + fVar82;
          auVar63._4_4_ = local_2720._4_4_ + fVar88;
          auVar63._8_4_ = local_2720._8_4_ + fVar89;
          auVar63._12_4_ = local_2720._12_4_ + fVar90;
          fVar94 = local_2510._0_4_;
          auVar72._0_4_ = auVar57._0_4_ * fVar94;
          fVar96 = local_2510._4_4_;
          auVar72._4_4_ = auVar57._4_4_ * fVar96;
          fVar98 = local_2510._8_4_;
          auVar72._8_4_ = auVar57._8_4_ * fVar98;
          auVar60._0_4_ = local_2510._12_4_;
          auVar72._12_4_ = auVar57._12_4_ * auVar60._0_4_;
          auVar39 = vfmsub231ps_fma(auVar72,local_2500,auVar63);
          local_24f0 = vsubps_avx(local_24d0,auVar38);
          fVar95 = local_24f0._0_4_;
          auVar83._0_4_ = auVar63._0_4_ * fVar95;
          fVar97 = local_24f0._4_4_;
          auVar83._4_4_ = auVar63._4_4_ * fVar97;
          fVar99 = local_24f0._8_4_;
          auVar83._8_4_ = auVar63._8_4_ * fVar99;
          fVar104 = local_24f0._12_4_;
          auVar83._12_4_ = auVar63._12_4_ * fVar104;
          auVar64._0_4_ = local_24d0._0_4_ + auVar38._0_4_;
          auVar64._4_4_ = local_24d0._4_4_ + auVar38._4_4_;
          auVar64._8_4_ = local_24d0._8_4_ + auVar38._8_4_;
          auVar64._12_4_ = local_24d0._12_4_ + auVar38._12_4_;
          auVar68 = vfmsub231ps_fma(auVar83,local_2510,auVar64);
          fVar106 = local_2500._0_4_;
          auVar65._0_4_ = fVar106 * auVar64._0_4_;
          auVar53._0_4_ = local_2500._4_4_;
          auVar65._4_4_ = auVar53._0_4_ * auVar64._4_4_;
          fVar108 = local_2500._8_4_;
          auVar65._8_4_ = fVar108 * auVar64._8_4_;
          fVar109 = local_2500._12_4_;
          auVar65._12_4_ = fVar109 * auVar64._12_4_;
          auVar8 = vfmsub231ps_fma(auVar65,local_24f0,auVar57);
          auVar66._0_4_ = local_2710._4_4_ * auVar8._0_4_;
          auVar66._4_4_ = local_2710._4_4_ * auVar8._4_4_;
          auVar66._8_4_ = local_2710._4_4_ * auVar8._8_4_;
          auVar66._12_4_ = local_2710._4_4_ * auVar8._12_4_;
          auVar68 = vfmadd231ps_fma(auVar66,auVar32,auVar68);
          local_2520 = vfmadd231ps_fma(auVar68,local_2790,auVar39);
          auVar68 = vsubps_avx(auVar38,auVar45);
          auVar73._0_4_ = auVar38._0_4_ + auVar45._0_4_;
          auVar73._4_4_ = auVar38._4_4_ + auVar45._4_4_;
          auVar73._8_4_ = auVar38._8_4_ + auVar45._8_4_;
          auVar73._12_4_ = auVar38._12_4_ + auVar45._12_4_;
          auVar39 = vsubps_avx(auVar79,auVar80);
          auVar47._0_4_ = auVar79._0_4_ + auVar80._0_4_;
          auVar47._4_4_ = auVar79._4_4_ + auVar80._4_4_;
          auVar47._8_4_ = auVar79._8_4_ + auVar80._8_4_;
          auVar47._12_4_ = auVar79._12_4_ + auVar80._12_4_;
          auVar80 = vsubps_avx(local_2720,auVar67);
          auVar40._0_4_ = local_2720._0_4_ + auVar67._0_4_;
          auVar40._4_4_ = local_2720._4_4_ + auVar67._4_4_;
          auVar40._8_4_ = local_2720._8_4_ + auVar67._8_4_;
          auVar40._12_4_ = local_2720._12_4_ + auVar67._12_4_;
          auVar69._0_4_ = auVar80._0_4_ * auVar47._0_4_;
          auVar69._4_4_ = auVar80._4_4_ * auVar47._4_4_;
          auVar69._8_4_ = auVar80._8_4_ * auVar47._8_4_;
          auVar69._12_4_ = auVar80._12_4_ * auVar47._12_4_;
          auVar79 = vfmsub231ps_fma(auVar69,auVar39,auVar40);
          auVar41._0_4_ = auVar40._0_4_ * auVar68._0_4_;
          auVar41._4_4_ = auVar40._4_4_ * auVar68._4_4_;
          auVar41._8_4_ = auVar40._8_4_ * auVar68._8_4_;
          auVar41._12_4_ = auVar40._12_4_ * auVar68._12_4_;
          auVar38 = vfmsub231ps_fma(auVar41,auVar80,auVar73);
          auVar74._0_4_ = auVar39._0_4_ * auVar73._0_4_;
          auVar74._4_4_ = auVar39._4_4_ * auVar73._4_4_;
          auVar74._8_4_ = auVar39._8_4_ * auVar73._8_4_;
          auVar74._12_4_ = auVar39._12_4_ * auVar73._12_4_;
          auVar45 = vfmsub231ps_fma(auVar74,auVar68,auVar47);
          local_2710._0_4_ = local_2710._4_4_;
          fStack_2708 = local_2710._4_4_;
          fStack_2704 = local_2710._4_4_;
          auVar48._0_4_ = local_2710._4_4_ * auVar45._0_4_;
          auVar48._4_4_ = local_2710._4_4_ * auVar45._4_4_;
          auVar48._8_4_ = local_2710._4_4_ * auVar45._8_4_;
          auVar48._12_4_ = local_2710._4_4_ * auVar45._12_4_;
          auVar38 = vfmadd231ps_fma(auVar48,auVar32,auVar38);
          auVar67 = vfmadd231ps_fma(auVar38,local_2790,auVar79);
          local_2540._0_4_ = auVar67._0_4_ + local_2640._0_4_ + local_2520._0_4_;
          local_2540._4_4_ = auVar67._4_4_ + local_2640._4_4_ + local_2520._4_4_;
          local_2540._8_4_ = auVar67._8_4_ + local_2640._8_4_ + local_2520._8_4_;
          local_2540._12_4_ = auVar67._12_4_ + local_2640._12_4_ + local_2520._12_4_;
          auVar38 = vminps_avx(local_2640._0_16_,local_2520);
          auVar79 = vminps_avx(auVar38,auVar67);
          auVar38 = vandps_avx(local_2540,local_2650);
          auVar70._0_4_ = auVar38._0_4_ * 1.1920929e-07;
          auVar70._4_4_ = auVar38._4_4_ * 1.1920929e-07;
          auVar70._8_4_ = auVar38._8_4_ * 1.1920929e-07;
          auVar70._12_4_ = auVar38._12_4_ * 1.1920929e-07;
          uVar27 = CONCAT44(auVar70._4_4_,auVar70._0_4_);
          auVar75._0_8_ = uVar27 ^ 0x8000000080000000;
          auVar75._8_4_ = -auVar70._8_4_;
          auVar75._12_4_ = -auVar70._12_4_;
          auVar79 = vcmpps_avx(auVar79,auVar75,5);
          auVar45 = vmaxps_avx(local_2640._0_16_,local_2520);
          auVar45 = vmaxps_avx(auVar45,auVar67);
          auVar45 = vcmpps_avx(auVar45,auVar70,2);
          local_2530 = vorps_avx(auVar79,auVar45);
          auVar8._8_8_ = uStack_2658;
          auVar8._0_8_ = local_2660;
          auVar8 = auVar8 & local_2530;
          local_26e0._0_8_ = lVar19;
          if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar8[0xf] < '\0') {
            auVar42._0_4_ = fVar106 * local_26f0._0_4_;
            auVar42._4_4_ = auVar53._0_4_ * local_26f0._4_4_;
            auVar42._8_4_ = fVar108 * local_26f0._8_4_;
            auVar42._12_4_ = fVar109 * local_26f0._12_4_;
            local_2550 = 0x80000000;
            uStack_254c = 0x80000000;
            uStack_2548 = 0x80000000;
            uStack_2544 = 0x80000000;
            auVar71._0_4_ = fVar95 * local_2740._0_4_;
            auVar71._4_4_ = fVar97 * local_2740._4_4_;
            auVar71._8_4_ = fVar99 * local_2740._8_4_;
            auVar71._12_4_ = fVar104 * local_2740._12_4_;
            auVar67 = vfmsub213ps_fma(local_2740,local_2510,auVar42);
            auVar49._0_4_ = fVar94 * auVar39._0_4_;
            auVar49._4_4_ = fVar96 * auVar39._4_4_;
            auVar49._8_4_ = fVar98 * auVar39._8_4_;
            auVar49._12_4_ = auVar60._0_4_ * auVar39._12_4_;
            auVar76._0_4_ = auVar80._0_4_ * fVar95;
            auVar76._4_4_ = auVar80._4_4_ * fVar97;
            auVar76._8_4_ = auVar80._8_4_ * fVar99;
            auVar76._12_4_ = auVar80._12_4_ * fVar104;
            auVar80 = vfmsub213ps_fma(auVar80,local_2500,auVar49);
            local_2740 = auVar38;
            local_2720 = local_2640._0_16_;
            auVar79 = vandps_avx(local_2650,auVar42);
            auVar45 = vandps_avx(local_2650,auVar49);
            auVar79 = vcmpps_avx(auVar79,auVar45,1);
            local_25c0 = vblendvps_avx(auVar80,auVar67,auVar79);
            auVar84._0_4_ = fVar106 * auVar68._0_4_;
            auVar84._4_4_ = auVar53._0_4_ * auVar68._4_4_;
            auVar84._8_4_ = fVar108 * auVar68._8_4_;
            auVar84._12_4_ = fVar109 * auVar68._12_4_;
            auVar80 = vfmsub213ps_fma(auVar68,local_2510,auVar76);
            auVar50._0_4_ = fVar94 * local_2730._0_4_;
            auVar50._4_4_ = fVar96 * local_2730._4_4_;
            auVar50._8_4_ = fVar98 * local_2730._8_4_;
            auVar50._12_4_ = auVar60._0_4_ * local_2730._12_4_;
            auVar53 = vfmsub213ps_fma(local_26f0,local_24f0,auVar50);
            auVar79 = vandps_avx(local_2650,auVar50);
            auVar45 = vandps_avx(local_2650,auVar76);
            auVar79 = vcmpps_avx(auVar79,auVar45,1);
            local_25b0 = vblendvps_avx(auVar80,auVar53,auVar79);
            auVar80 = vfmsub213ps_fma(local_2730,local_2500,auVar71);
            auVar53 = vfmsub213ps_fma(auVar39,local_24f0,auVar84);
            auVar79 = vandps_avx(local_2650,auVar71);
            auVar45 = vandps_avx(local_2650,auVar84);
            auVar79 = vcmpps_avx(auVar79,auVar45,1);
            local_25a0[0] = vblendvps_avx(auVar53,auVar80,auVar79);
            auVar58._0_4_ = local_25a0[0]._0_4_ * local_2710._4_4_;
            auVar58._4_4_ = local_25a0[0]._4_4_ * local_2710._4_4_;
            auVar58._8_4_ = local_25a0[0]._8_4_ * local_2710._4_4_;
            auVar58._12_4_ = local_25a0[0]._12_4_ * local_2710._4_4_;
            auVar79 = vfmadd213ps_fma(auVar32,local_25b0,auVar58);
            auVar79 = vfmadd213ps_fma(local_2790,local_25c0,auVar79);
            auVar59._0_4_ = auVar79._0_4_ + auVar79._0_4_;
            auVar59._4_4_ = auVar79._4_4_ + auVar79._4_4_;
            auVar59._8_4_ = auVar79._8_4_ + auVar79._8_4_;
            auVar59._12_4_ = auVar79._12_4_ + auVar79._12_4_;
            auVar77._0_4_ = local_25a0[0]._0_4_ * fVar82;
            auVar77._4_4_ = local_25a0[0]._4_4_ * fVar88;
            auVar77._8_4_ = local_25a0[0]._8_4_ * fVar89;
            auVar77._12_4_ = local_25a0[0]._12_4_ * fVar90;
            auVar79 = vfmadd213ps_fma(local_24e0,local_25b0,auVar77);
            auVar45 = vfmadd213ps_fma(local_24d0,local_25c0,auVar79);
            auVar79 = vrcpps_avx(auVar59);
            auVar93._8_4_ = 0x3f800000;
            auVar93._0_8_ = 0x3f8000003f800000;
            auVar93._12_4_ = 0x3f800000;
            auVar80 = vfnmadd213ps_fma(auVar79,auVar59,auVar93);
            auVar79 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
            local_25d0._0_4_ = auVar79._0_4_ * (auVar45._0_4_ + auVar45._0_4_);
            local_25d0._4_4_ = auVar79._4_4_ * (auVar45._4_4_ + auVar45._4_4_);
            local_25d0._8_4_ = auVar79._8_4_ * (auVar45._8_4_ + auVar45._8_4_);
            local_25d0._12_4_ = auVar79._12_4_ * (auVar45._12_4_ + auVar45._12_4_);
            auVar37 = ZEXT1664(local_25d0);
            uVar17 = *(undefined4 *)((long)&This->leafIntersector + 4);
            auVar78._4_4_ = uVar17;
            auVar78._0_4_ = uVar17;
            auVar78._8_4_ = uVar17;
            auVar78._12_4_ = uVar17;
            auVar79 = vcmpps_avx(auVar78,local_25d0,2);
            uVar17 = *(undefined4 *)&(This->intersector1).intersect;
            auVar85._4_4_ = uVar17;
            auVar85._0_4_ = uVar17;
            auVar85._8_4_ = uVar17;
            auVar85._12_4_ = uVar17;
            auVar45 = vcmpps_avx(local_25d0,auVar85,2);
            auVar79 = vandps_avx(auVar45,auVar79);
            uVar27 = CONCAT44(auVar59._4_4_,auVar59._0_4_);
            auVar86._0_8_ = uVar27 ^ 0x8000000080000000;
            auVar86._8_4_ = -auVar59._8_4_;
            auVar86._12_4_ = -auVar59._12_4_;
            auVar45 = vcmpps_avx(auVar59,auVar86,4);
            auVar79 = vandps_avx(auVar45,auVar79);
            auVar14._8_8_ = uStack_2658;
            auVar14._0_8_ = local_2660;
            auVar45 = vandps_avx(local_2530,auVar14);
            auVar79 = vpslld_avx(auVar79,0x1f);
            auVar80 = vpsrad_avx(auVar79,0x1f);
            auVar79 = auVar45 & auVar80;
            if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar79[0xf] < '\0') {
              local_26e0._8_8_ = auVar54._8_8_;
              auVar2._0_8_ = (This->intersector1).intersect;
              auVar2._8_8_ = (This->intersector1).occluded;
              auVar81 = ZEXT1664(auVar2);
              auVar79 = vandps_avx(auVar80,auVar45);
              local_2640._16_16_ = local_2520;
              local_2620 = local_2540;
              local_2610 = &local_2791;
              local_2600 = auVar79;
              local_2710 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
              local_2700 = auVar79;
              auVar45 = vrcpps_avx(local_2540);
              auVar51._8_4_ = 0x3f800000;
              auVar51._0_8_ = 0x3f8000003f800000;
              auVar51._12_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_fma(local_2540,auVar45,auVar51);
              auVar45 = vfmadd132ps_fma(auVar54,auVar45,auVar45);
              auVar43._8_4_ = 0x219392ef;
              auVar43._0_8_ = 0x219392ef219392ef;
              auVar43._12_4_ = 0x219392ef;
              auVar38 = vcmpps_avx(auVar38,auVar43,5);
              auVar38 = vandps_avx(auVar45,auVar38);
              auVar33._0_4_ = local_2640._0_4_ * auVar38._0_4_;
              auVar33._4_4_ = local_2640._4_4_ * auVar38._4_4_;
              auVar33._8_4_ = local_2640._8_4_ * auVar38._8_4_;
              auVar33._12_4_ = local_2640._12_4_ * auVar38._12_4_;
              local_25f0 = vminps_avx(auVar33,auVar51);
              auVar34._0_4_ = auVar38._0_4_ * local_2520._0_4_;
              auVar34._4_4_ = auVar38._4_4_ * local_2520._4_4_;
              auVar34._8_4_ = auVar38._8_4_ * local_2520._8_4_;
              auVar34._12_4_ = auVar38._12_4_ * local_2520._12_4_;
              local_25e0 = vminps_avx(auVar34,auVar51);
              auVar35._8_4_ = 0x7f800000;
              auVar35._0_8_ = 0x7f8000007f800000;
              auVar35._12_4_ = 0x7f800000;
              auVar38 = vblendvps_avx(auVar35,local_25d0,auVar79);
              auVar45 = vshufps_avx(auVar38,auVar38,0xb1);
              auVar45 = vminps_avx(auVar45,auVar38);
              auVar54 = vshufpd_avx(auVar45,auVar45,1);
              auVar45 = vminps_avx(auVar54,auVar45);
              auVar38 = vcmpps_avx(auVar38,auVar45,0);
              auVar45 = auVar79 & auVar38;
              if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar45[0xf] < '\0') {
                auVar79 = vandps_avx(auVar38,auVar79);
              }
              uVar15 = vextractps_avx(auVar2,1);
              uVar27 = (ulong)context >> 0x20;
              uVar17 = vmovmskps_avx(auVar79);
              context = (RayQueryContext *)0x0;
              for (uVar27 = CONCAT44((int)uVar27,uVar17); (uVar27 & 1) == 0;
                  uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                context = (RayQueryContext *)((long)&context->scene + 1);
              }
              uStack_2778 = auVar32._8_8_;
              local_2780 = lVar20 + uVar18;
              lVar19 = lVar20 + uVar18;
              do {
                local_2740 = auVar81._0_16_;
                local_2678 = *(uint *)(lVar19 + 0x90 + (long)context * 4);
                lVar19 = *(long *)(*(long *)(local_2710 + 0x1e8) + (ulong)local_2678 * 8);
                if ((*(uint *)(lVar19 + 0x34) & uVar15) == 0) {
                  *(undefined4 *)(local_2700 + (long)context * 4) = 0;
                }
                else {
                  local_2790._0_8_ = context;
                  lVar20 = *(long *)&(ray->super_RayK<1>).dir.field_0;
                  local_2720._0_8_ = lVar20;
                  if (*(long *)(lVar20 + 0x10) == 0) {
                    local_26b0 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                    if (*(long *)(lVar19 + 0x40) == 0) {
                      uVar17 = *(undefined4 *)(local_25f0 + (long)context * 4);
                      uVar1 = *(undefined4 *)(local_25e0 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).intersect =
                           *(undefined4 *)(local_25d0 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).pointQuery =
                           *(undefined4 *)(local_25c0 + (long)context * 4);
                      *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                           *(undefined4 *)(local_25b0 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).name =
                           *(undefined4 *)(local_25a0[0] + (long)context * 4);
                      *(undefined4 *)((long)&(This->intersector1).name + 4) = uVar17;
                      *(undefined4 *)&(This->intersector4).intersect = uVar1;
                      *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                           *(undefined4 *)(local_2780 + 0xa0 + (long)context * 4);
                      *(uint *)&(This->intersector4).occluded = local_2678;
                      context = (RayQueryContext *)0x0;
                      *(undefined4 *)((long)&(This->intersector4).occluded + 4) = *local_26b0;
                      *(undefined4 *)&(This->intersector4).name = local_26b0[1];
                      break;
                    }
                  }
                  else {
                    local_26b0 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  }
                  local_2690 = *(undefined4 *)(local_25c0 + (long)context * 4);
                  local_268c = *(undefined4 *)(local_25b0 + (long)context * 4);
                  local_2688 = *(undefined4 *)(local_25a0[0] + (long)context * 4);
                  local_2684 = *(undefined4 *)(local_25f0 + (long)context * 4);
                  local_2680 = *(undefined4 *)(local_25e0 + (long)context * 4);
                  local_267c = *(undefined4 *)(local_2780 + 0xa0 + (long)context * 4);
                  local_2674 = *local_26b0;
                  local_2670 = local_26b0[1];
                  *(undefined4 *)&(This->intersector1).intersect =
                       *(undefined4 *)(local_25d0 + (long)context * 4);
                  local_2744 = -1;
                  local_26c0 = &local_2744;
                  context = *(RayQueryContext **)(lVar19 + 0x18);
                  local_26b8 = context;
                  local_26a8 = This;
                  local_26a0 = &local_2690;
                  local_2698 = 1;
                  local_2730._0_8_ = lVar19;
                  local_26f0 = auVar37._0_16_;
                  if (*(code **)(lVar19 + 0x40) == (code *)0x0) {
LAB_01510654:
                    if ((*(RTCIntersectArguments **)(local_2720._0_8_ + 0x10) !=
                         (RTCIntersectArguments *)0x0) &&
                       ((context = (RayQueryContext *)local_2720._0_8_,
                        ((ulong)*(Scene **)local_2720._0_8_ & 2) != 0 ||
                        (context = (RayQueryContext *)local_2730._0_8_,
                        ((ulong)((RayQueryContext *)(local_2730._0_8_ + 0x30))->user &
                        0x40000000000000) != 0)))) {
                      (*(code *)*(RTCIntersectArguments **)(local_2720._0_8_ + 0x10))(&local_26c0);
                      auVar37 = ZEXT1664(local_26f0);
                      This = local_2758;
                      ray = local_2750;
                      uVar22 = local_2760;
                      uVar23 = local_2768;
                      if (*local_26c0 == 0) goto LAB_01510713;
                    }
                    *(undefined4 *)&(local_26a8->intersector1).pointQuery = *local_26a0;
                    *(undefined4 *)((long)&(local_26a8->intersector1).pointQuery + 4) =
                         local_26a0[1];
                    *(undefined4 *)&(local_26a8->intersector1).name = local_26a0[2];
                    *(undefined4 *)((long)&(local_26a8->intersector1).name + 4) = local_26a0[3];
                    *(undefined4 *)&(local_26a8->intersector4).intersect = local_26a0[4];
                    *(undefined4 *)((long)&(local_26a8->intersector4).intersect + 4) = local_26a0[5]
                    ;
                    *(undefined4 *)&(local_26a8->intersector4).occluded = local_26a0[6];
                    *(undefined4 *)((long)&(local_26a8->intersector4).occluded + 4) = local_26a0[7];
                    context = (RayQueryContext *)0x0;
                    *(undefined4 *)&(local_26a8->intersector4).name = local_26a0[8];
                  }
                  else {
                    (**(code **)(lVar19 + 0x40))(&local_26c0);
                    auVar37 = ZEXT1664(local_26f0);
                    This = local_2758;
                    ray = local_2750;
                    uVar22 = local_2760;
                    uVar23 = local_2768;
                    if (*local_26c0 != 0) goto LAB_01510654;
LAB_01510713:
                    *(undefined4 *)&(local_2758->intersector1).intersect = local_2740._0_4_;
                    This = local_2758;
                    ray = local_2750;
                    uVar22 = local_2760;
                    uVar23 = local_2768;
                  }
                  *(undefined4 *)(local_2700 + local_2790._0_8_ * 4) = 0;
                  uVar17 = *(undefined4 *)&(This->intersector1).intersect;
                  auVar36._4_4_ = uVar17;
                  auVar36._0_4_ = uVar17;
                  auVar36._8_4_ = uVar17;
                  auVar36._12_4_ = uVar17;
                  auVar38 = vcmpps_avx(auVar37._0_16_,auVar36,2);
                  local_2700 = vandps_avx(auVar38,local_2700);
                  auVar3._0_8_ = (This->intersector1).intersect;
                  auVar3._8_8_ = (This->intersector1).occluded;
                  auVar81 = ZEXT1664(auVar3);
                  uVar15 = vextractps_avx(auVar3,1);
                }
                if ((((local_2700 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2700 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2700 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2700[0xf]) break;
                auVar44._8_4_ = 0x7f800000;
                auVar44._0_8_ = 0x7f8000007f800000;
                auVar44._12_4_ = 0x7f800000;
                auVar38 = vblendvps_avx(auVar44,auVar37._0_16_,local_2700);
                auVar79 = vshufps_avx(auVar38,auVar38,0xb1);
                auVar79 = vminps_avx(auVar79,auVar38);
                auVar45 = vshufpd_avx(auVar79,auVar79,1);
                auVar79 = vminps_avx(auVar45,auVar79);
                auVar79 = vcmpps_avx(auVar38,auVar79,0);
                auVar45 = local_2700 & auVar79;
                auVar38 = local_2700;
                if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar45[0xf] < '\0') {
                  auVar38 = vandps_avx(auVar79,local_2700);
                }
                uVar27 = (ulong)context >> 0x20;
                uVar17 = vmovmskps_avx(auVar38);
                context = (RayQueryContext *)0x0;
                for (uVar27 = CONCAT44((int)uVar27,uVar17); lVar19 = local_2780, (uVar27 & 1) == 0;
                    uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                  context = (RayQueryContext *)((long)&context->scene + 1);
                }
              } while( true );
            }
          }
          auVar87 = ZEXT3264(local_23c0);
          auVar91 = ZEXT3264(local_23e0);
          auVar92 = ZEXT3264(local_2400);
          auVar100 = ZEXT3264(local_2440);
          auVar102 = ZEXT3264(local_2460);
          auVar105 = ZEXT3264(local_24a0);
          auVar107 = ZEXT3264(local_24c0);
          auVar81 = ZEXT3264(local_2580);
          auVar60._0_4_ = local_2420;
          fVar94 = fStack_241c;
          fVar95 = fStack_2418;
          fVar96 = fStack_2414;
          fVar97 = fStack_2410;
          fVar98 = fStack_240c;
          fVar99 = fStack_2408;
          auVar53._0_4_ = local_2480;
          fVar104 = fStack_247c;
          fVar82 = fStack_2478;
          fVar88 = fStack_2474;
          fVar89 = fStack_2470;
          fVar90 = fStack_246c;
          fVar106 = fStack_2468;
          lVar19 = local_26e0._0_8_ + 1;
        }
        uVar17 = *(undefined4 *)&(This->intersector1).intersect;
        auVar37 = ZEXT3264(CONCAT428(uVar17,CONCAT424(uVar17,CONCAT420(uVar17,CONCAT416(uVar17,
                                                  CONCAT412(uVar17,CONCAT48(uVar17,CONCAT44(uVar17,
                                                  uVar17))))))));
      }
      goto LAB_0150fb75;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }